

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.h
# Opt level: O2

void rapidjson::internal::Grisu2(double value,char *buffer,int *length,int *K)

{
  ulong uVar1;
  uint uVar2;
  DiyFp DVar3;
  DiyFp DVar4;
  DiyFp w_m;
  DiyFp w_p;
  DiyFp v;
  DiyFp local_90;
  DiyFp local_80;
  DiyFp local_70;
  DiyFp local_60;
  DiyFp local_50;
  DiyFp local_40;
  
  uVar2 = (uint)((ulong)value >> 0x34) & 0x7ff;
  local_40.f = ((ulong)value & 0xfffffffffffff) + 0x10000000000000;
  if (uVar2 == 0) {
    local_40.f = (ulong)value & 0xfffffffffffff;
  }
  local_40.e = -0x432;
  if (uVar2 != 0) {
    local_40.e = uVar2 - 0x433;
  }
  DiyFp::NormalizedBoundaries(&local_40,&local_80,&local_50);
  DVar3 = GetCachedPower(local_50.e,K);
  local_60.f = DVar3.f;
  local_60.e = DVar3.e;
  uVar1 = 0x3f;
  if (local_40.f != 0) {
    for (; local_40.f >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  local_90.f = local_40.f << ((byte)(uVar1 ^ 0x3f) & 0x3f);
  local_90.e = local_40.e - (int)(uVar1 ^ 0x3f);
  DVar3 = DiyFp::operator*(&local_90,&local_60);
  local_70.f = DVar3.f;
  local_70.e = DVar3.e;
  DVar3 = DiyFp::operator*(&local_50,&local_60);
  local_90.e = DVar3.e;
  DVar4 = DiyFp::operator*(&local_80,&local_60);
  local_90.f = DVar3.f - 1;
  DigitGen(&local_70,&local_90,(~DVar4.f + DVar3.f) - 1,buffer,length,K);
  return;
}

Assistant:

inline void Grisu2(double value, char* buffer, int* length, int* K) {
    const DiyFp v(value);
    DiyFp w_m, w_p;
    v.NormalizedBoundaries(&w_m, &w_p);

    const DiyFp c_mk = GetCachedPower(w_p.e, K);
    const DiyFp W = v.Normalize() * c_mk;
    DiyFp Wp = w_p * c_mk;
    DiyFp Wm = w_m * c_mk;
    Wm.f++;
    Wp.f--;
    DigitGen(W, Wp, Wp.f - Wm.f, buffer, length, K);
}